

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

bool __thiscall QMimeBinaryProvider::checkCacheChanged(QMimeBinaryProvider *this)

{
  weak_ordering wVar1;
  long in_FS_OFFSET;
  QFileInfo fileInfo;
  Data local_38;
  QDateTime local_30;
  QFileInfo local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo
            (&local_28,
             (QFileDevice *)
             (this->m_cacheFile)._M_t.
             super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl);
  local_38 = (Data)0x2;
  QFileInfo::fileTime((QFileInfo *)&local_30,(FileTime)&local_28,(QTimeZone *)0x3);
  wVar1 = compareThreeWay(&local_30,
                          &((this->m_cacheFile)._M_t.
                            super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                            .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>.
                           _M_head_impl)->m_mtime);
  QDateTime::~QDateTime(&local_30);
  QTimeZone::~QTimeZone((QTimeZone *)&local_38.s);
  if ('\0' < wVar1.m_order) {
    CacheFile::reload((this->m_cacheFile)._M_t.
                      super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                      .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl);
  }
  QFileInfo::~QFileInfo(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return '\0' < wVar1.m_order;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeBinaryProvider::checkCacheChanged()
{
    QFileInfo fileInfo(m_cacheFile->file);
    if (fileInfo.lastModified(QTimeZone::UTC) > m_cacheFile->m_mtime) {
        // Deletion can't happen by just running update-mime-database.
        // But the user could use rm -rf :-)
        m_cacheFile->reload(); // will mark itself as invalid on failure
        return true;
    }
    return false;
}